

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i *fullResolution,
          vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
          *dp,Allocator alloc)

{
  int iVar1;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar2;
  long in_RCX;
  undefined4 in_ESI;
  long *in_RDI;
  Point2i *in_R8;
  HaltonPixelIndexer *unaff_retaddr;
  uint32_t in_stack_0000001c;
  long *plVar3;
  undefined4 in_stack_ffffffffffffffc0;
  
  *in_RDI = in_RCX;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  HaltonPixelIndexer::HaltonPixelIndexer(unaff_retaddr,in_R8);
  plVar3 = in_RDI + 7;
  iVar1 = std::numeric_limits<int>::max();
  std::numeric_limits<int>::max();
  Point2<int>::Point2((Point2<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                      (int)((ulong)plVar3 >> 0x20),(int)plVar3);
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  if (in_RCX == 0) {
    pvVar2 = ComputeRadicalInversePermutations(in_stack_0000001c,(Allocator)dp);
    *in_RDI = (long)pvVar2;
  }
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, const Point2i &fullResolution,
                             pstd::vector<DigitPermutation> *dp, Allocator alloc)
    : digitPermutations(dp),
      samplesPerPixel(samplesPerPixel),
      haltonPixelIndexer(fullResolution) {
    // Generate random digit permutations for Halton sampler
    if (!dp)
        digitPermutations = ComputeRadicalInversePermutations(0, alloc);
}